

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void yy_accept(yyParser *yypParser)

{
  simple_token **ppsVar1;
  simple_token **result;
  yyParser *yypParser_local;
  
  ppsVar1 = yypParser->result;
  if (yyTraceFILE != (FILE *)0x0) {
    fprintf((FILE *)yyTraceFILE,"%sAccept!\n",yyTracePrompt);
  }
  yypParser->yyerrcnt = -1;
  if (yypParser->yytos == yypParser->yystack) {
    yypParser->result = ppsVar1;
    return;
  }
  __assert_fail("yypParser->yytos == yypParser->yystack",
                "/workspace/llm4binary/github/license_c_cmakelists/fletcher[P]tdp/src/parser.c",
                0x435,"void yy_accept(yyParser *)");
}

Assistant:

static void yy_accept(
	yyParser * yypParser          /* The parser */
) {
	TDPParseARG_FETCH;
#ifndef NDEBUG

	if ( yyTraceFILE ) {
		fprintf(yyTraceFILE, "%sAccept!\n", yyTracePrompt);
	}

#endif
#ifndef YYNOERRORRECOVERY
	yypParser->yyerrcnt = -1;
#endif
	assert( yypParser->yytos == yypParser->yystack );
	/* Here code is inserted which will be executed whenever the
	** parser accepts */
	/*********** Begin %parse_accept code *****************************************/

//	printf("parsing completed successfully!\n");
	/*********** End %parse_accept code *******************************************/
	TDPParseARG_STORE; /* Suppress warning about unused %extra_argument variable */
}